

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

RefcountedTemplate * __thiscall
ctemplate::TemplateCache::GetTemplateLocked
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateCacheKey *template_cache_key)

{
  bool bVar1;
  TemplateState TVar2;
  Template *pTVar3;
  char *pcVar4;
  time_t mtime;
  pair<unsigned_long,_int> v;
  RefcountedTemplate *local_1e0;
  CachedTemplate local_170;
  Template *local_160;
  Template *tpl_1;
  FileStat statbuf;
  string local_b0 [32];
  undefined1 local_90 [8];
  string resolved;
  RefcountedTemplate *local_70;
  TemplateCallMap *local_68;
  Template *local_50;
  Template *tpl;
  ulong local_40;
  second_type *local_38;
  CachedTemplate *it;
  TemplateCacheKey *template_cache_key_local;
  TemplateString *pTStack_20;
  Strip strip_local;
  TemplateString *filename_local;
  TemplateCache *this_local;
  
  tpl = (Template *)template_cache_key->first;
  local_40 = *(ulong *)&template_cache_key->second;
  v.first = local_40 & 0xffffffff;
  v._8_8_ = tpl;
  it = (CachedTemplate *)template_cache_key;
  template_cache_key_local._4_4_ = strip;
  pTStack_20 = filename;
  filename_local = (TemplateString *)this;
  local_38 = find_ptr<std::unordered_map<std::pair<unsigned_long,int>,ctemplate::TemplateCache::CachedTemplate,ctemplate::TemplateCache::TemplateCacheHash,std::equal_to<std::pair<unsigned_long,int>>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>>,std::pair<unsigned_long,int>>
                       ((ctemplate *)this->parsed_template_cache_,
                        (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
                         *)tpl,v);
  if (local_38 == (second_type *)0x0) {
    if ((this->is_frozen_ & 1U) != 0) {
      return (RefcountedTemplate *)0x0;
    }
    pTVar3 = (Template *)operator_new(0xc0);
    Template::Template(pTVar3,pTStack_20,template_cache_key_local._4_4_,this);
    local_50 = pTVar3;
    local_38 = std::
               unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
               ::operator[](this->parsed_template_cache_,(key_type *)it);
    CachedTemplate::CachedTemplate((CachedTemplate *)&stack0xffffffffffffff90,local_50,FILE_BASED);
    local_38->refcounted_tpl = local_70;
    *(TemplateCallMap **)&local_38->should_reload = local_68;
    if (local_38 == (second_type *)0x0) {
      __assert_fail("it",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_cache.cc"
                    ,300,
                    "TemplateCache::RefcountedTemplate *ctemplate::TemplateCache::GetTemplateLocked(const TemplateString &, Strip, const TemplateCacheKey &)"
                   );
    }
  }
  if ((local_38->should_reload & 1U) == 0) goto LAB_0015d931;
  pTVar3 = RefcountedTemplate::tpl(local_38->refcounted_tpl);
  pcVar4 = Template::original_filename(pTVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,pcVar4,(allocator *)((long)statbuf.internal_statbuf.__glibc_reserved + 0x17));
  FindTemplateFilename((TemplateCache *)local_90,(string *)this);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)statbuf.internal_statbuf.__glibc_reserved + 0x17));
  if (local_38->template_type == FILE_BASED) {
    pTVar3 = RefcountedTemplate::tpl(local_38->refcounted_tpl);
    pcVar4 = Template::template_file(pTVar3);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,pcVar4);
    if (!bVar1) {
      pTVar3 = RefcountedTemplate::tpl(local_38->refcounted_tpl);
      pcVar4 = Template::template_file(pTVar3);
      pTVar3 = RefcountedTemplate::tpl(local_38->refcounted_tpl);
      mtime = Template::mtime(pTVar3);
      bVar1 = HasTemplateChangedOnDisk(pcVar4,mtime,(FileStat *)&tpl_1);
      if (!bVar1) goto LAB_0015d90d;
    }
    pTVar3 = (Template *)operator_new(0xc0);
    Template::Template(pTVar3,pTStack_20,template_cache_key_local._4_4_,this);
    local_160 = pTVar3;
    RefcountedTemplate::DecRef(local_38->refcounted_tpl);
    CachedTemplate::CachedTemplate(&local_170,local_160,FILE_BASED);
    local_38->refcounted_tpl = local_170.refcounted_tpl;
    local_38->should_reload = local_170.should_reload;
    *(undefined3 *)&local_38->field_0x9 = local_170._9_3_;
    local_38->template_type = local_170.template_type;
  }
LAB_0015d90d:
  local_38->should_reload = false;
  std::__cxx11::string::~string((string *)local_90);
LAB_0015d931:
  pTVar3 = RefcountedTemplate::tpl(local_38->refcounted_tpl);
  TVar2 = Template::state(pTVar3);
  if (TVar2 == TS_READY) {
    local_1e0 = local_38->refcounted_tpl;
  }
  else {
    local_1e0 = (RefcountedTemplate *)0x0;
  }
  return local_1e0;
}

Assistant:

TemplateCache::RefcountedTemplate* TemplateCache::GetTemplateLocked(
    const TemplateString& filename,
    Strip strip,
    const TemplateCacheKey& template_cache_key) {
  // NOTE: A write-lock must be held on mutex_ when this method is called.
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  if (!it) {
    // If the cache is frozen and the template doesn't already exist in cache,
    // do not load the template, return NULL.
    if (is_frozen_) {
      return NULL;
    }
    // TODO(panicker): Validate the filename here, and if the file can't be
    // resolved then insert a NULL in the cache.
    // If validation succeeds then pass in resolved filename, mtime &
    // file length (from statbuf) to the constructor.
    const Template* tpl = new Template(filename, strip, this);
    it = &(*parsed_template_cache_)[template_cache_key];
    *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    assert(it);
  }
  if (it->should_reload) {
    // check if the template has changed on disk or if a new template with the
    // same name has been added earlier in the search path:
    const string resolved = FindTemplateFilename(
        it->refcounted_tpl->tpl()->original_filename());
    FileStat statbuf;
    if (it->template_type == CachedTemplate::FILE_BASED &&
        (resolved != it->refcounted_tpl->tpl()->template_file() ||
         HasTemplateChangedOnDisk(
             it->refcounted_tpl->tpl()->template_file(),
             it->refcounted_tpl->tpl()->mtime(),
             &statbuf))) {
      // Create a new template, insert it into the cache under
      // template_cache_key, and DecRef() the old one to indicate
      // the cache no longer has a reference to it.
      const Template* tpl = new Template(filename, strip, this);
      // DecRef after creating the new template since DecRef may free up
      // the storage for filename,
      it->refcounted_tpl->DecRef();
      *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    }
    it->should_reload = false;
  }

  // If the state is TS_ERROR, we leave the state as is, but return
  // NULL.  We won't try to load the template file again until the
  // reload status is set to true by another call to ReloadAllIfChanged.
  return it->refcounted_tpl->tpl()->state() == TS_READY ? it->refcounted_tpl : NULL;
}